

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void update_perf_tbl_with_cptp_json_perf_data(AppCtx *ctx,PerfProfRunHandle *handle)

{
  cJSON *root;
  PerfProfRun run;
  PerfProfRun PStack_68;
  
  make_solver_run(&PStack_68,ctx->current_batch,handle->solver_name);
  if (handle->json_output_path[0] != '\0') {
    root = load_json(handle->json_output_path);
    if (root != (cJSON *)0x0) {
      parse_cptp_solver_json_dump(&PStack_68,root);
      cJSON_Delete(root);
    }
  }
  store_perfprof_run(&ctx->perf_tbl,&(handle->input).uid,&PStack_68);
  return;
}

Assistant:

static void
update_perf_tbl_with_cptp_json_perf_data(AppCtx *ctx,
                                         PerfProfRunHandle *handle) {
    PerfProfRun run = make_solver_run(ctx->current_batch, handle->solver_name);
    if (handle->json_output_path[0] != '\0') {
        cJSON *root = load_json(handle->json_output_path);
        if (root) {
            parse_cptp_solver_json_dump(&run, root);
            cJSON_Delete(root);
        }
    }
    store_perfprof_run(&ctx->perf_tbl, &handle->input.uid, &run);
}